

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *tinfo,
                 _func_void_ptr_void_ptr *copy_constructor,_func_void_ptr_void_ptr *move_constructor
                 ,void *existing_holder)

{
  bool bVar1;
  PyObject *ptr;
  PyObject **ppPVar2;
  value_and_holder *this;
  void *pvVar3;
  char *pcVar4;
  cast_error *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  allocator<char> local_151;
  undefined1 local_150 [8];
  string type_name_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  undefined1 local_e0 [8];
  string type_name;
  iterator local_b0;
  void **local_80;
  void **valueptr;
  instance *wrapper;
  handle local_68;
  object inst;
  object local_50;
  void *local_48;
  void *src;
  _func_void_ptr_void_ptr *move_constructor_local;
  _func_void_ptr_void_ptr *copy_constructor_local;
  type_info *tinfo_local;
  void *pvStack_20;
  return_value_policy policy_local;
  void *_src_local;
  handle parent_local;
  handle registered_inst;
  
  src = move_constructor;
  move_constructor_local = copy_constructor;
  copy_constructor_local = (_func_void_ptr_void_ptr *)tinfo;
  tinfo_local._7_1_ = policy;
  pvStack_20 = _src;
  _src_local = parent.m_ptr;
  if (tinfo == (type_info *)0x0) {
    memset(&parent_local,0,8);
    pybind11::handle::handle(&parent_local);
  }
  else {
    local_48 = _src;
    if (_src == (void *)0x0) {
      none::none((none *)&local_50);
      parent_local = object::release(&local_50);
      none::~none((none *)&local_50);
    }
    else {
      parent_local = find_registered_python_instance(_src,tinfo);
      bVar1 = pybind11::handle::operator_cast_to_bool(&parent_local);
      if (!bVar1) {
        ptr = make_new_instance(*(PyTypeObject **)copy_constructor_local);
        pybind11::handle::handle((handle *)&wrapper,ptr);
        reinterpret_steal<pybind11::object>((pybind11 *)&local_68,(handle)wrapper);
        ppPVar2 = pybind11::handle::ptr(&local_68);
        valueptr = (void **)*ppPVar2;
        ((instance *)valueptr)->field_0x30 = ((instance *)valueptr)->field_0x30 & 0xfe;
        values_and_holders::values_and_holders
                  ((values_and_holders *)((long)&type_name.field_2 + 8),(instance *)valueptr);
        values_and_holders::begin(&local_b0,(values_and_holders *)((long)&type_name.field_2 + 8));
        this = values_and_holders::iterator::operator->(&local_b0);
        local_80 = value_and_holder::value_ptr<void>(this);
        switch(tinfo_local._7_1_) {
        case automatic:
        case take_ownership:
          *local_80 = local_48;
          *(byte *)(valueptr + 6) = *(byte *)(valueptr + 6) & 0xfe | 1;
          break;
        case automatic_reference:
        case reference:
          *local_80 = local_48;
          *(byte *)(valueptr + 6) = *(byte *)(valueptr + 6) & 0xfe;
          break;
        case copy:
          if (move_constructor_local == (_func_void_ptr_void_ptr *)0x0) {
            pcVar4 = std::type_info::name(*(type_info **)(copy_constructor_local + 8));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)local_e0,pcVar4,&local_e1);
            std::allocator<char>::~allocator(&local_e1);
            clean_type_id((string *)local_e0);
            type_name_1.field_2._M_local_buf[0xf] = '\x01';
            pcVar5 = (cast_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_128,"return_value_policy = copy, but type ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0);
            std::operator+(&local_108,&local_128," is non-copyable!");
            cast_error::runtime_error(pcVar5,&local_108);
            type_name_1.field_2._M_local_buf[0xf] = '\0';
            __cxa_throw(pcVar5,&cast_error::typeinfo,cast_error::~cast_error);
          }
          pvVar3 = (*move_constructor_local)(local_48);
          *local_80 = pvVar3;
          *(byte *)(valueptr + 6) = *(byte *)(valueptr + 6) & 0xfe | 1;
          break;
        case move:
          if (src == (void *)0x0) {
            if (move_constructor_local == (_func_void_ptr_void_ptr *)0x0) {
              pcVar4 = std::type_info::name(*(type_info **)(copy_constructor_local + 8));
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_150,pcVar4,&local_151);
              std::allocator<char>::~allocator(&local_151);
              clean_type_id((string *)local_150);
              pcVar5 = (cast_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_198,"return_value_policy = move, but type ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_150);
              std::operator+(&local_178,&local_198," is neither movable nor copyable!");
              cast_error::runtime_error(pcVar5,&local_178);
              __cxa_throw(pcVar5,&cast_error::typeinfo,cast_error::~cast_error);
            }
            pvVar3 = (*move_constructor_local)(local_48);
            *local_80 = pvVar3;
          }
          else {
            pvVar3 = (void *)(*(code *)src)(local_48);
            *local_80 = pvVar3;
          }
          *(byte *)(valueptr + 6) = *(byte *)(valueptr + 6) & 0xfe | 1;
          break;
        case reference_internal:
          *local_80 = local_48;
          *(byte *)(valueptr + 6) = *(byte *)(valueptr + 6) & 0xfe;
          keep_alive_impl(local_68,(handle)_src_local);
          break;
        default:
          pcVar5 = (cast_error *)__cxa_allocate_exception(0x10);
          cast_error::runtime_error(pcVar5,"unhandled return_value_policy: should not happen!");
          __cxa_throw(pcVar5,&cast_error::typeinfo,cast_error::~cast_error);
        }
        (**(code **)(copy_constructor_local + 0x30))(valueptr,existing_holder);
        parent_local = object::release((object *)&local_68);
        object::~object((object *)&local_68);
      }
    }
  }
  return (handle)parent_local.m_ptr;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const detail::type_info *tinfo,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        if (!tinfo) // no type info: error will be set already
            return handle();

        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().release();

        if (handle registered_inst = find_registered_python_instance(src, tinfo))
            return registered_inst;

        auto inst = reinterpret_steal<object>(make_new_instance(tinfo->type));
        auto wrapper = reinterpret_cast<instance *>(inst.ptr());
        wrapper->owned = false;
        void *&valueptr = values_and_holders(wrapper).begin()->value_ptr();

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                valueptr = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                valueptr = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    valueptr = copy_constructor(src);
                else {
#if defined(NDEBUG)
                    throw cast_error("return_value_policy = copy, but type is "
                                     "non-copyable! (compile in debug mode for details)");
#else
                    std::string type_name(tinfo->cpptype->name());
                    detail::clean_type_id(type_name);
                    throw cast_error("return_value_policy = copy, but type " +
                                     type_name + " is non-copyable!");
#endif
                }
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    valueptr = move_constructor(src);
                else if (copy_constructor)
                    valueptr = copy_constructor(src);
                else {
#if defined(NDEBUG)
                    throw cast_error("return_value_policy = move, but type is neither "
                                     "movable nor copyable! "
                                     "(compile in debug mode for details)");
#else
                    std::string type_name(tinfo->cpptype->name());
                    detail::clean_type_id(type_name);
                    throw cast_error("return_value_policy = move, but type " +
                                     type_name + " is neither movable nor copyable!");
#endif
                }
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                valueptr = src;
                wrapper->owned = false;
                keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_instance(wrapper, existing_holder);

        return inst.release();
    }